

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall
toml::internal::Lexer::nextToken(Token *__return_storage_ptr__,Lexer *this,bool isValueToken)

{
  bool bVar1;
  char c;
  byte local_29;
  
LAB_001697c8:
  do {
    bVar1 = current(this,(char *)&local_29);
    if (!bVar1) {
      __return_storage_ptr__->type_ = END_OF_FILE;
LAB_00169855:
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      (__return_storage_ptr__->str_value_)._M_string_length = 0;
      (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->time_value_).__d.__r = 0;
      return __return_storage_ptr__;
    }
    switch(local_29) {
    case 0x20:
      goto switchD_001697f7_caseD_20;
    case 0x21:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2d:
switchD_001697f7_caseD_21:
      if (isValueToken) {
        nextValue(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      nextKey(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x22:
      nextStringDoubleQuote(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x23:
      goto switchD_001697f7_caseD_23;
    case 0x27:
      nextStringSingleQuote(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x2c:
      next(this);
      __return_storage_ptr__->type_ = COMMA;
      goto LAB_00169855;
    case 0x2e:
      next(this);
      __return_storage_ptr__->type_ = DOT;
      goto LAB_00169855;
    default:
      if ((local_29 != 9) && (local_29 != 0xd)) {
        if (local_29 == 10) {
          next(this);
          __return_storage_ptr__->type_ = END_OF_LINE;
        }
        else if (local_29 == 0x3d) {
          next(this);
          __return_storage_ptr__->type_ = EQUAL;
        }
        else if (local_29 == 0x5b) {
          next(this);
          __return_storage_ptr__->type_ = LBRACKET;
        }
        else if (local_29 == 0x5d) {
          next(this);
          __return_storage_ptr__->type_ = RBRACKET;
        }
        else if (local_29 == 0x7b) {
          next(this);
          __return_storage_ptr__->type_ = LBRACE;
        }
        else {
          if (local_29 != 0x7d) goto switchD_001697f7_caseD_21;
          next(this);
          __return_storage_ptr__->type_ = RBRACE;
        }
        goto LAB_00169855;
      }
switchD_001697f7_caseD_20:
      next(this);
    }
  } while( true );
switchD_001697f7_caseD_23:
  skipUntilNewLine(this);
  goto LAB_001697c8;
}

Assistant:

inline Token Lexer::nextToken(bool isValueToken)
{
    char c;
    while (current(&c)) {
        if (c == ' ' || c == '\t' || c == '\r') {
            next();
            continue;
        }

        if (c == '#') {
            skipUntilNewLine();
            continue;
        }

        switch (c) {
        case '\n':
            next();
            return Token(TokenType::END_OF_LINE);
        case '=':
            next();
            return Token(TokenType::EQUAL);
        case '{':
            next();
            return Token(TokenType::LBRACE);
        case '}':
            next();
            return Token(TokenType::RBRACE);
        case '[':
            next();
            return Token(TokenType::LBRACKET);
        case ']':
            next();
            return Token(TokenType::RBRACKET);
        case ',':
            next();
            return Token(TokenType::COMMA);
        case '.':
            next();
            return Token(TokenType::DOT);
        case '\"':
            return nextStringDoubleQuote();
        case '\'':
            return nextStringSingleQuote();
        default:
            if (isValueToken) {
                return nextValue();
            } else {
                return nextKey();
            }
        }
    }

    return Token(TokenType::END_OF_FILE);
}